

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp,stbi__result_info *ri)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  stbi_uc sVar5;
  stbi_uc sVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uchar *puVar11;
  undefined7 extraout_var;
  stbi_uc *psVar12;
  char *pcVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  stbi_uc *psVar18;
  uint y;
  uint uVar19;
  uint uVar20;
  byte *pbVar21;
  long in_FS_OFFSET;
  stbi_uc value [4];
  stbi__pic_packet packets [10];
  ulong local_b8;
  stbi_uc local_ac [4];
  stbi_uc *local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  int local_84;
  ulong local_80;
  ulong local_78;
  long local_70;
  uint *local_68;
  uint *local_60;
  char local_57 [39];
  
  iVar16 = 0x5c;
  local_68 = (uint *)px;
  local_60 = (uint *)py;
  do {
    stbi__get8(s);
    iVar16 = iVar16 + -1;
  } while (iVar16 != 0);
  bVar3 = stbi__get8(s);
  bVar4 = stbi__get8(s);
  sVar5 = stbi__get8(s);
  sVar6 = stbi__get8(s);
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001099e0:
    if (s->img_buffer_end <= s->img_buffer) {
LAB_00109e52:
      pcVar13 = "bad file";
      goto LAB_00109e6b;
    }
  }
  else {
    iVar16 = (*(s->io).eof)(s->io_user_data);
    if (iVar16 != 0) {
      if (s->read_from_callbacks != 0) goto LAB_001099e0;
      goto LAB_00109e52;
    }
  }
  local_a0 = (ulong)bVar3 << 8;
  uVar17 = (int)local_a0 + (uint)bVar4;
  uVar15 = (ulong)uVar17;
  y = (uint)CONCAT11(sVar5,sVar6);
  if ((CONCAT11(sVar5,sVar6) == 0) ||
     ((uVar17 <= (uint)(0x7fffffff / (ulong)y) && (y * uVar17 < 0x20000000)))) {
    stbi__get32be(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    stbi__get8(s);
    bVar3 = 0;
    puVar11 = (uchar *)stbi__malloc_mad3(uVar17,y,4,0);
    if (puVar11 != (uchar *)0x0) {
      local_84 = uVar17 * 4;
      local_98 = uVar15;
      memset(puVar11,0xff,(ulong)(local_84 * y));
      pbVar21 = (byte *)(local_57 + 1);
      lVar14 = 0;
      do {
        iVar16 = (int)uVar15;
        if (lVar14 == 10) {
LAB_00109e78:
          pcVar13 = "bad format";
LAB_00109e88:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar13;
LAB_00109ea0:
          free(puVar11);
          puVar11 = (uchar *)0x0;
          uVar17 = (uint)local_98;
          goto LAB_00109eb1;
        }
        local_90 = lVar14;
        sVar5 = stbi__get8(s);
        uVar15 = CONCAT71(extraout_var,sVar5) & 0xffffffff;
        iVar16 = (int)CONCAT71(extraout_var,sVar5);
        bVar7 = stbi__get8(s);
        pbVar21[-2] = bVar7;
        bVar8 = stbi__get8(s);
        pbVar21[-1] = bVar8;
        bVar8 = stbi__get8(s);
        *pbVar21 = bVar8;
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00109b1d:
          if (s->img_buffer < s->img_buffer_end) goto LAB_00109b31;
LAB_00109e81:
          pcVar13 = "bad file";
          goto LAB_00109e88;
        }
        iVar9 = (*(s->io).eof)(s->io_user_data);
        if (iVar9 != 0) {
          if (s->read_from_callbacks != 0) goto LAB_00109b1d;
          goto LAB_00109e81;
        }
LAB_00109b31:
        if (bVar7 != 8) goto LAB_00109e78;
        bVar3 = bVar3 | bVar8;
        pbVar21 = pbVar21 + 3;
        lVar14 = local_90 + 1;
      } while ((char)uVar15 != '\0');
      iVar16 = 4 - (uint)((bVar3 & 0x10) == 0);
      if (comp != (int *)0x0) {
        *comp = iVar16;
      }
      uVar17 = (uint)local_98;
      if (y != 0) {
        local_80 = (ulong)y;
        local_b8._0_4_ = (uint)bVar4;
        local_a0 = (ulong)((int)local_a0 + (uint)local_b8);
        uVar15 = 0;
        local_90 = lVar14;
        do {
          local_a8 = puVar11 + local_84 * (int)uVar15;
          lVar14 = 0;
          local_78 = uVar15;
          do {
            lVar2 = lVar14 * 3;
            cVar1 = local_57[lVar2];
            iVar9 = (int)local_98;
            local_70 = lVar14;
            if (cVar1 == '\0') {
              if (iVar9 != 0) {
                bVar3 = local_57[lVar2 + 1];
                uVar15 = local_a0 & 0xffffffff;
                psVar18 = local_a8;
                do {
                  psVar12 = stbi__readval(s,(uint)bVar3,psVar18);
                  if (psVar12 == (stbi_uc *)0x0) goto LAB_00109ea0;
                  psVar18 = psVar18 + 4;
                  uVar17 = (int)uVar15 - 1;
                  uVar15 = (ulong)uVar17;
                } while (uVar17 != 0);
              }
            }
            else if (cVar1 == '\x01') {
              uVar15 = local_98 & 0xffffffff;
              psVar18 = local_a8;
              if (iVar9 != 0) {
                do {
                  bVar3 = stbi__get8(s);
                  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00109d69:
                    if (s->img_buffer_end <= s->img_buffer) goto LAB_00109efa;
                  }
                  else {
                    iVar9 = (*(s->io).eof)(s->io_user_data);
                    if (iVar9 != 0) {
                      if (s->read_from_callbacks != 0) goto LAB_00109d69;
                      goto LAB_00109efa;
                    }
                  }
                  psVar12 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_ac);
                  if (psVar12 == (stbi_uc *)0x0) goto LAB_00109ea0;
                  uVar10 = (uint)uVar15;
                  uVar17 = (uint)bVar3;
                  if (uVar10 < bVar3) {
                    uVar17 = uVar10;
                  }
                  uVar19 = uVar17 & 0xff;
                  if ((char)uVar17 != '\0') {
                    uVar17 = 0;
                    do {
                      bVar3 = local_57[lVar2 + 1];
                      uVar20 = 0x80;
                      lVar14 = 0;
                      do {
                        if ((uVar20 & bVar3) != 0) {
                          psVar18[lVar14] = local_ac[lVar14];
                        }
                        lVar14 = lVar14 + 1;
                        uVar20 = uVar20 >> 1;
                      } while (lVar14 != 4);
                      uVar17 = uVar17 + 1;
                      psVar18 = psVar18 + 4;
                    } while (uVar17 != uVar19);
                  }
                  uVar15 = (ulong)(uVar10 - uVar19);
                } while (uVar10 - uVar19 != 0 && (int)uVar19 <= (int)uVar10);
              }
            }
            else {
              if (cVar1 != '\x02') {
                *(char **)(in_FS_OFFSET + -0x20) = "bad format";
                goto LAB_00109ea0;
              }
              local_b8 = local_98 & 0xffffffff;
              psVar18 = local_a8;
              if (iVar9 != 0) {
LAB_00109c10:
                bVar3 = stbi__get8(s);
                if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00109c38:
                  if (s->img_buffer_end <= s->img_buffer) goto LAB_00109efa;
                }
                else {
                  iVar9 = (*(s->io).eof)(s->io_user_data);
                  if (iVar9 != 0) {
                    if (s->read_from_callbacks != 0) goto LAB_00109c38;
LAB_00109efa:
                    *(char **)(in_FS_OFFSET + -0x20) = "bad file";
                    goto LAB_00109ea0;
                  }
                }
                uVar10 = (uint)bVar3;
                uVar17 = (uint)local_b8;
                if ((char)bVar3 < '\0') {
                  if (uVar10 == 0x80) {
                    sVar5 = stbi__get8(s);
                    sVar6 = stbi__get8(s);
                    uVar19 = (uint)CONCAT11(sVar5,sVar6);
                  }
                  else {
                    uVar19 = uVar10 - 0x7f;
                  }
                  if ((int)(uint)local_b8 < (int)uVar19) goto LAB_00109efa;
                  psVar12 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],local_ac);
                  if (psVar12 == (stbi_uc *)0x0) goto LAB_00109ea0;
                  if (0 < (int)uVar19) {
                    uVar10 = 0;
                    do {
                      bVar3 = local_57[lVar2 + 1];
                      uVar20 = 0x80;
                      lVar14 = 0;
                      do {
                        if ((uVar20 & bVar3) != 0) {
                          psVar18[lVar14] = local_ac[lVar14];
                        }
                        lVar14 = lVar14 + 1;
                        uVar20 = uVar20 >> 1;
                      } while (lVar14 != 4);
                      uVar10 = uVar10 + 1;
                      psVar18 = psVar18 + 4;
                    } while (uVar10 != uVar19);
                  }
                }
                else {
                  uVar19 = bVar3 + 1;
                  uVar20 = uVar19;
                  if ((uint)local_b8 <= uVar10) {
                    *(char **)(in_FS_OFFSET + -0x20) = "bad file";
                    goto LAB_00109ea0;
                  }
                  do {
                    psVar12 = stbi__readval(s,(uint)(byte)local_57[lVar2 + 1],psVar18);
                    if (psVar12 == (stbi_uc *)0x0) goto LAB_00109ea0;
                    psVar18 = psVar18 + 4;
                    uVar20 = uVar20 - 1;
                  } while (uVar20 != 0);
                }
                uVar10 = (uint)local_b8 - uVar19;
                local_b8 = (ulong)uVar10;
                if (uVar10 == 0 || (int)uVar17 < (int)uVar19) goto LAB_00109e17;
                goto LAB_00109c10;
              }
            }
LAB_00109e17:
            lVar14 = local_70 + 1;
            uVar17 = (uint)local_98;
          } while (local_90 != lVar14);
          uVar15 = local_78 + 1;
        } while (uVar15 != local_80);
      }
LAB_00109eb1:
      *local_68 = uVar17;
      *local_60 = y;
      if (req_comp != 0) {
        iVar16 = req_comp;
      }
      if (req_comp == 0 && comp != (int *)0x0) {
        iVar16 = *comp;
      }
      puVar11 = stbi__convert_format(puVar11,4,iVar16,uVar17,y);
      return puVar11;
    }
    pcVar13 = "outofmem";
  }
  else {
    pcVar13 = "too large";
  }
LAB_00109e6b:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar13;
  return (void *)0x0;
}

Assistant:

static void *stbi__pic_load(stbi__context *s,int *px,int *py,int *comp,int req_comp, stbi__result_info *ri)
{
   stbi_uc *result;
   int i, x,y, internal_comp;
   STBI_NOTUSED(ri);

   if (!comp) comp = &internal_comp;

   for (i=0; i<92; ++i)
      stbi__get8(s);

   x = stbi__get16be(s);
   y = stbi__get16be(s);

   if (y > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");
   if (x > STBI_MAX_DIMENSIONS) return stbi__errpuc("too large","Very large image (corrupt?)");

   if (stbi__at_eof(s))  return stbi__errpuc("bad file","file too short (pic header)");
   if (!stbi__mad3sizes_valid(x, y, 4, 0)) return stbi__errpuc("too large", "PIC image too large to decode");

   stbi__get32be(s); //skip `ratio'
   stbi__get16be(s); //skip `fields'
   stbi__get16be(s); //skip `pad'

   // intermediate buffer is RGBA
   result = (stbi_uc *) stbi__malloc_mad3(x, y, 4, 0);
   if (!result) return stbi__errpuc("outofmem", "Out of memory");
   memset(result, 0xff, x*y*4);

   if (!stbi__pic_load_core(s,x,y,comp, result)) {
      STBI_FREE(result);
      result=0;
   }
   *px = x;
   *py = y;
   if (req_comp == 0) req_comp = *comp;
   result=stbi__convert_format(result,4,req_comp,x,y);

   return result;
}